

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.h
# Opt level: O2

void __thiscall chrono::ChSystem::RemoveBody(ChSystem *this,shared_ptr<chrono::ChBody> *body)

{
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChAssembly::RemoveBody(&this->assembly,(shared_ptr<chrono::ChBody> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

virtual void RemoveBody(std::shared_ptr<ChBody> body) { assembly.RemoveBody(body); }